

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueStore.cpp
# Opt level: O3

void __thiscall xercesc_4_0::ValueStore::endValueScope(ValueStore *this)

{
  IdentityConstraint *pIVar1;
  int iVar2;
  XMLCh *text2;
  XMLCh *text1;
  Codes toEmit;
  XMLValidator *this_00;
  
  pIVar1 = this->fIdentityConstraint;
  if (this->fValuesCount == 0) {
    iVar2 = (*(pIVar1->super_XSerializable)._vptr_XSerializable[5])();
    if (((short)iVar2 == 1) && (this->fDoReportError == true)) {
      this_00 = this->fScanner->fValidator;
      text1 = this->fIdentityConstraint->fElemName;
      toEmit = IC_AbsentKeyValue;
      text2 = (XMLCh *)0x0;
LAB_0030c0c4:
      XMLValidator::emitError(this_00,toEmit,text1,text2,(XMLCh *)0x0,(XMLCh *)0x0);
      return;
    }
  }
  else if (((pIVar1->fFields == (RefVectorOf<xercesc_4_0::IC_Field> *)0x0) ||
           (this->fValuesCount !=
            (pIVar1->fFields->super_BaseRefVectorOf<xercesc_4_0::IC_Field>).fCurCount)) &&
          (this->fDoReportError == true)) {
    iVar2 = (*(pIVar1->super_XSerializable)._vptr_XSerializable[5])();
    if ((short)iVar2 == 1) {
      this_00 = this->fScanner->fValidator;
      text2 = this->fIdentityConstraint->fIdentityConstraintName;
      text1 = this->fIdentityConstraint->fElemName;
      toEmit = IC_KeyNotEnoughValues;
      goto LAB_0030c0c4;
    }
  }
  return;
}

Assistant:

void ValueStore::endValueScope() {

    if (fValuesCount == 0) {

        if (fIdentityConstraint->getType() == IdentityConstraint::ICType_KEY && fDoReportError) {
            fScanner->getValidator()->emitError(XMLValid::IC_AbsentKeyValue,
                fIdentityConstraint->getElementName());
        }

        return;
    }

    // do we have enough values?
    if ((fValuesCount != fIdentityConstraint->getFieldCount()) && fDoReportError) {

        if(fIdentityConstraint->getType()==IdentityConstraint::ICType_KEY)
        {
			fScanner->getValidator()->emitError(XMLValid::IC_KeyNotEnoughValues,
                fIdentityConstraint->getElementName(), fIdentityConstraint->getIdentityConstraintName());
        }
    }
}